

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemPrivate::changeFlags(QStandardItemPrivate *this,bool enable,ItemFlags f)

{
  QFlags<Qt::ItemFlag> mask;
  QStandardItem *this_00;
  QFlagsStorage<Qt::ItemFlag> in_EDX;
  undefined1 in_SIL;
  QStandardItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QStandardItem *q;
  ItemFlags flags;
  undefined3 in_stack_ffffffffffffffdc;
  QFlagsStorage<Qt::ItemFlag> flags_00;
  QFlagsStorage<Qt::ItemFlag> local_10;
  QFlagsStorage<Qt::ItemFlag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  flags_00.i = CONCAT13(in_SIL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  local_c.i = in_EDX.i;
  this_00 = q_func(in_RDI);
  local_10.i = 0xaaaaaaaa;
  local_10.i = (Int)QStandardItem::flags(this_00);
  if ((flags_00.i & 0x1000000) == 0) {
    mask = QFlags<Qt::ItemFlag>::operator~((QFlags<Qt::ItemFlag> *)this_00);
    QFlags<Qt::ItemFlag>::operator&=((QFlags<Qt::ItemFlag> *)&local_10,mask);
  }
  else {
    QFlags<Qt::ItemFlag>::operator|=
              ((QFlags<Qt::ItemFlag> *)&local_10,(QFlags<Qt::ItemFlag>)local_c.i);
  }
  QStandardItem::setFlags(this_00,(ItemFlags)flags_00.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStandardItemPrivate::changeFlags(bool enable, Qt::ItemFlags f)
{
    Q_Q(QStandardItem);
    Qt::ItemFlags flags = q->flags();
    if (enable)
        flags |= f;
    else
        flags &= ~f;
    q->setFlags(flags);
}